

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O2

ssize_t __thiscall
OpenMesh::IO::_OFFReader_::read(_OFFReader_ *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint uVar2;
  mostream *pmVar3;
  ostream *poVar4;
  uint7 extraout_var;
  uint7 extraout_var_00;
  undefined4 in_register_00000034;
  istream *_in;
  uint uVar5;
  
  _in = (istream *)CONCAT44(in_register_00000034,__fd);
  iVar1 = *(int *)(_in + *(long *)(*(long *)_in + -0x18) + 0x20);
  if (iVar1 == 0) {
    (this->userOptions_).flags_ = *(value_type *)__nbytes;
    *(undefined4 *)__nbytes = 0;
    uVar2 = (this->options_).flags_;
    uVar5 = 0;
    if (((uVar2 & 0x10) != 0) && (((this->userOptions_).flags_ & 0x10) != 0)) {
      *(undefined4 *)__nbytes = 0x10;
      uVar2 = (this->options_).flags_;
      uVar5 = 0x10;
    }
    if (((uVar2 & 0x40) != 0) && (((this->userOptions_).flags_ & 0x40) != 0)) {
      uVar5 = uVar5 | 0x40;
      *(uint *)__nbytes = uVar5;
      uVar2 = (this->options_).flags_;
    }
    if (((uVar2 & 0x20) != 0) && (((this->userOptions_).flags_ & 0x20) != 0)) {
      uVar5 = uVar5 | 0x20;
      *(uint *)__nbytes = uVar5;
      uVar2 = (this->options_).flags_;
    }
    if (((uVar2 >> 9 & 1) != 0) && (((this->userOptions_).flags_ & 0x200) != 0)) {
      uVar5 = uVar5 | 0x200;
      *(uint *)__nbytes = uVar5;
      uVar2 = (this->options_).flags_;
    }
    if ((uVar2 & 1) != 0) {
      *(uint *)__nbytes = uVar5 | 1;
      uVar2 = (this->options_).flags_;
      if (((uVar2 & 1) != 0) && (((this->userOptions_).flags_ & 0x800) != 0)) {
        uVar2 = uVar2 | 0x800;
        (this->options_).flags_ = uVar2;
      }
    }
    if ((uVar2 & 1) == 0) {
      read_ascii(this,_in,(BaseImporter *)__buf,(Options *)__nbytes);
      poVar4 = (ostream *)((ulong)extraout_var << 8);
    }
    else {
      read_binary(this,_in,(BaseImporter *)__buf,(Options *)__nbytes,false);
      poVar4 = (ostream *)((ulong)extraout_var_00 << 8);
    }
  }
  else {
    pmVar3 = omerr();
    poVar4 = std::operator<<(&pmVar3->super_ostream,"[OMReader] : cannot not use stream ");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  }
  return CONCAT71((int7)((ulong)poVar4 >> 8),iVar1 == 0);
}

Assistant:

bool
_OFFReader_::read(std::istream& _in, BaseImporter& _bi, Options& _opt )
{
   if (!_in.good())
   {
     omerr() << "[OMReader] : cannot not use stream "
       << std::endl;
     return false;
   }

   // filter relevant options for reading
   bool swap = _opt.check( Options::Swap );


   userOptions_ = _opt;

   // build options to be returned
   _opt.clear();

   if (options_.vertex_has_normal() && userOptions_.vertex_has_normal())     _opt += Options::VertexNormal;
   if (options_.vertex_has_texcoord() && userOptions_.vertex_has_texcoord()) _opt += Options::VertexTexCoord;
   if (options_.vertex_has_color() && userOptions_.vertex_has_color())       _opt += Options::VertexColor;
   if (options_.face_has_color() && userOptions_.face_has_color())           _opt += Options::FaceColor;
   if (options_.is_binary())                                                 _opt += Options::Binary;

   //force user-choice for the alpha value when reading binary
   if ( options_.is_binary() && userOptions_.color_has_alpha() )
     options_ += Options::ColorAlpha;

    return (options_.is_binary() ?
 	   read_binary(_in, _bi, _opt, swap) :
	   read_ascii(_in, _bi, _opt));

}